

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_mesh_shading.cpp
# Opt level: O3

spv_result_t spvtools::val::MeshShadingPass(ValidationState_t *_,Instruction *inst)

{
  size_t *psVar1;
  uint16_t uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint32_t uVar6;
  uint id;
  StorageClass SVar7;
  Function *pFVar8;
  _Node *p_Var9;
  Instruction *this;
  long lVar10;
  char *pcVar11;
  string local_268;
  _Any_data local_248;
  code *local_238;
  code *local_230;
  _Any_data local_228;
  code *local_218;
  code *local_210;
  DiagnosticStream local_208;
  
  uVar2 = (inst->inst_).opcode;
  if (uVar2 == 0x3b) {
    bVar3 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityMeshShadingEXT);
    if (!bVar3) {
      return SPV_SUCCESS;
    }
    bVar3 = IsInterfaceVariable(_,inst,ExecutionModelMeshEXT);
    bVar4 = IsInterfaceVariable(_,inst,ExecutionModelFragment);
    SVar7 = Instruction::GetOperandAs<spv::StorageClass>(inst,2);
    bVar5 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,DecorationPerPrimitiveEXT);
    if (!bVar5) {
      return SPV_SUCCESS;
    }
    if (!bVar4 || SVar7 == Input) {
      if (!bVar3 || SVar7 == Output) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_268,_,0x10f0,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_268._M_dataplus._M_p,local_268._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,
                 "PerPrimitiveEXT decoration must be applied only to variables in the Output Storage Class in the Storage Class in the MeshEXT Execution Model."
                 ,0x8d);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00684ef7;
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar11 = 
    "PerPrimitiveEXT decoration must be applied only to variables in the Input Storage Class in the Fragment Execution Model."
    ;
    lVar10 = 0x78;
  }
  else if (uVar2 == 0x14af) {
    pFVar8 = ValidationState_t::function(_,inst->function_->id_);
    local_248._M_unused._M_object = (void *)0x0;
    local_248._8_8_ = 0;
    local_230 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_mesh_shading.cpp:101:15)>
                ::_M_invoke;
    local_238 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_mesh_shading.cpp:101:15)>
                ::_M_manager;
    p_Var9 = std::__cxx11::
             list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
             ::_M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                       ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                         *)&pFVar8->execution_model_limitations_,
                        (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                         *)&local_248);
    std::__detail::_List_node_base::_M_hook(&p_Var9->super__List_node_base);
    psVar1 = &(pFVar8->execution_model_limitations_).
              super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if (local_238 != (code *)0x0) {
      (*local_238)(&local_248,&local_248,__destroy_functor);
    }
    uVar6 = ValidationState_t::GetOperandTypeId(_,inst,0);
    bVar3 = ValidationState_t::IsUnsignedIntScalarType(_,uVar6);
    if ((bVar3) && (uVar6 = ValidationState_t::GetBitWidth(_,uVar6), uVar6 == 0x20)) {
      uVar6 = ValidationState_t::GetOperandTypeId(_,inst,1);
      bVar3 = ValidationState_t::IsUnsignedIntScalarType(_,uVar6);
      if ((bVar3) && (uVar6 = ValidationState_t::GetBitWidth(_,uVar6), uVar6 == 0x20)) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar11 = "Primitive Count must be a 32-bit unsigned int scalar";
      lVar10 = 0x34;
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar11 = "Vertex Count must be a 32-bit unsigned int scalar";
      lVar10 = 0x31;
    }
  }
  else {
    if (uVar2 != 0x14ae) {
      return SPV_SUCCESS;
    }
    pFVar8 = ValidationState_t::function(_,inst->function_->id_);
    local_228._M_unused._M_object = (void *)0x0;
    local_228._8_8_ = 0;
    local_210 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_mesh_shading.cpp:50:15)>
                ::_M_invoke;
    local_218 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_mesh_shading.cpp:50:15)>
                ::_M_manager;
    p_Var9 = std::__cxx11::
             list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
             ::_M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                       ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                         *)&pFVar8->execution_model_limitations_,
                        (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                         *)&local_228);
    std::__detail::_List_node_base::_M_hook(&p_Var9->super__List_node_base);
    psVar1 = &(pFVar8->execution_model_limitations_).
              super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if (local_218 != (code *)0x0) {
      (*local_218)(&local_228,&local_228,__destroy_functor);
    }
    uVar6 = ValidationState_t::GetOperandTypeId(_,inst,0);
    bVar3 = ValidationState_t::IsUnsignedIntScalarType(_,uVar6);
    if ((bVar3) && (uVar6 = ValidationState_t::GetBitWidth(_,uVar6), uVar6 == 0x20)) {
      uVar6 = ValidationState_t::GetOperandTypeId(_,inst,1);
      bVar3 = ValidationState_t::IsUnsignedIntScalarType(_,uVar6);
      if ((bVar3) && (uVar6 = ValidationState_t::GetBitWidth(_,uVar6), uVar6 == 0x20)) {
        uVar6 = ValidationState_t::GetOperandTypeId(_,inst,2);
        bVar3 = ValidationState_t::IsUnsignedIntScalarType(_,uVar6);
        if ((bVar3) && (uVar6 = ValidationState_t::GetBitWidth(_,uVar6), uVar6 == 0x20)) {
          if ((long)(inst->operands_).
                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(inst->operands_).
                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                    _M_impl.super__Vector_impl_data._M_start != 0x40) {
            return SPV_SUCCESS;
          }
          id = Instruction::GetOperandAs<unsigned_int>(inst,3);
          this = ValidationState_t::FindDef(_,id);
          if ((this->inst_).opcode == 0x3b) {
            SVar7 = Instruction::GetOperandAs<spv::StorageClass>(this,2);
            if (SVar7 == StorageClassTaskPayloadWorkgroupEXT) {
              return SPV_SUCCESS;
            }
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar11 = "Payload OpVariable must have a storage class of TaskPayloadWorkgroupEXT";
            lVar10 = 0x47;
          }
          else {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar11 = "Payload must be the result of a OpVariable";
            lVar10 = 0x2a;
          }
          goto LAB_00684ee5;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar11 = "Group Count Z must be a 32-bit unsigned int scalar";
      }
      else {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar11 = "Group Count Y must be a 32-bit unsigned int scalar";
      }
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar11 = "Group Count X must be a 32-bit unsigned int scalar";
    }
    lVar10 = 0x32;
  }
LAB_00684ee5:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar11,lVar10);
LAB_00684ef7:
  DiagnosticStream::~DiagnosticStream(&local_208);
  return local_208.error_;
}

Assistant:

spv_result_t MeshShadingPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  switch (opcode) {
    case spv::Op::OpEmitMeshTasksEXT: {
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::TaskEXT) {
                  if (message) {
                    *message =
                        "OpEmitMeshTasksEXT requires TaskEXT execution model";
                  }
                  return false;
                }
                return true;
              });

      const uint32_t group_count_x = _.GetOperandTypeId(inst, 0);
      if (!_.IsUnsignedIntScalarType(group_count_x) ||
          _.GetBitWidth(group_count_x) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Group Count X must be a 32-bit unsigned int scalar";
      }

      const uint32_t group_count_y = _.GetOperandTypeId(inst, 1);
      if (!_.IsUnsignedIntScalarType(group_count_y) ||
          _.GetBitWidth(group_count_y) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Group Count Y must be a 32-bit unsigned int scalar";
      }

      const uint32_t group_count_z = _.GetOperandTypeId(inst, 2);
      if (!_.IsUnsignedIntScalarType(group_count_z) ||
          _.GetBitWidth(group_count_z) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Group Count Z must be a 32-bit unsigned int scalar";
      }

      if (inst->operands().size() == 4) {
        const auto payload = _.FindDef(inst->GetOperandAs<uint32_t>(3));
        if (payload->opcode() != spv::Op::OpVariable) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Payload must be the result of a OpVariable";
        }
        if (payload->GetOperandAs<spv::StorageClass>(2) !=
            spv::StorageClass::TaskPayloadWorkgroupEXT) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Payload OpVariable must have a storage class of "
                    "TaskPayloadWorkgroupEXT";
        }
      }
      break;
    }

    case spv::Op::OpSetMeshOutputsEXT: {
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::MeshEXT) {
                  if (message) {
                    *message =
                        "OpSetMeshOutputsEXT requires MeshEXT execution model";
                  }
                  return false;
                }
                return true;
              });

      const uint32_t vertex_count = _.GetOperandTypeId(inst, 0);
      if (!_.IsUnsignedIntScalarType(vertex_count) ||
          _.GetBitWidth(vertex_count) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Vertex Count must be a 32-bit unsigned int scalar";
      }

      const uint32_t primitive_count = _.GetOperandTypeId(inst, 1);
      if (!_.IsUnsignedIntScalarType(primitive_count) ||
          _.GetBitWidth(primitive_count) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Primitive Count must be a 32-bit unsigned int scalar";
      }

      break;
    }

    case spv::Op::OpWritePackedPrimitiveIndices4x8NV: {
      // No validation rules (for the moment).
      break;
    }
    case spv::Op::OpVariable: {
      if (_.HasCapability(spv::Capability::MeshShadingEXT)) {
        bool meshInterfaceVar =
            IsInterfaceVariable(_, inst, spv::ExecutionModel::MeshEXT);
        bool fragInterfaceVar =
            IsInterfaceVariable(_, inst, spv::ExecutionModel::Fragment);

        const spv::StorageClass storage_class =
            inst->GetOperandAs<spv::StorageClass>(2);
        bool storage_output = (storage_class == spv::StorageClass::Output);
        bool storage_input = (storage_class == spv::StorageClass::Input);

        if (_.HasDecoration(inst->id(), spv::Decoration::PerPrimitiveEXT)) {
          if (fragInterfaceVar && !storage_input) {
            return _.diag(SPV_ERROR_INVALID_DATA, inst)
                   << "PerPrimitiveEXT decoration must be applied only to "
                      "variables in the Input Storage Class in the Fragment "
                      "Execution Model.";
          }

          if (meshInterfaceVar && !storage_output) {
            return _.diag(SPV_ERROR_INVALID_DATA, inst)
                   << _.VkErrorID(4336)
                   << "PerPrimitiveEXT decoration must be applied only to "
                      "variables in the Output Storage Class in the "
                      "Storage Class in the MeshEXT Execution Model.";
          }
        }
      }
      break;
    }
    default:
      break;
  }

  return SPV_SUCCESS;
}